

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

grp_stack_data pop_grp_stack(grp_stack *mystack)

{
  grp_stack_item_struct *pgVar1;
  size_t sVar2;
  grp_stack_item *newtop;
  grp_stack_data retval;
  grp_stack *mystack_local;
  
  newtop = (grp_stack_item *)grp_stack_default;
  if ((mystack != (grp_stack *)0x0) && (mystack->top != (grp_stack_item *)0x0)) {
    pgVar1 = mystack->top->prev;
    newtop = (grp_stack_item *)grp_stack_remove(mystack->top);
    mystack->top = pgVar1;
    sVar2 = mystack->stack_size - 1;
    mystack->stack_size = sVar2;
    if (sVar2 == 0) {
      mystack->top = (grp_stack_item *)0x0;
    }
  }
  return (grp_stack_data)newtop;
}

Assistant:

static grp_stack_data pop_grp_stack(grp_stack* mystack) {
  grp_stack_data retval = grp_stack_default;
  if(mystack && mystack->top) {
    grp_stack_item* newtop = mystack->top->prev;
    retval = grp_stack_remove(mystack->top);
    mystack->top = newtop;
    if(0 == --mystack->stack_size) mystack->top = NULL;
  }
  return retval;
}